

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O3

uint64_t __thiscall
Imf_3_2::IDManifest::ChannelGroupManifest::insert(ChannelGroupManifest *this,string *text)

{
  size_t __n;
  int iVar1;
  uint uVar2;
  uint64_t idValue;
  ArgExc *this_00;
  stringstream _iex_throw_s;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  __n = (this->_hashScheme)._M_string_length;
  if (__n == DAT_003dab48) {
    if (__n != 0) {
      iVar1 = bcmp((this->_hashScheme)._M_dataplus._M_p,MURMURHASH3_32_abi_cxx11_,__n);
      if (iVar1 != 0) goto LAB_0018ddb7;
    }
    uVar2 = MurmurHash32(text);
    idValue = (uint64_t)uVar2;
  }
  else {
LAB_0018ddb7:
    if (__n != DAT_003dab68) {
LAB_0018de12:
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream(local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_190,"Cannot compute hash: unknown hashing scheme",0x2b);
      this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc(this_00,local_1a0);
      __cxa_throw(this_00,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
    }
    if (__n != 0) {
      iVar1 = bcmp((this->_hashScheme)._M_dataplus._M_p,MURMURHASH3_64_abi_cxx11_,__n);
      if (iVar1 != 0) goto LAB_0018de12;
    }
    idValue = MurmurHash64(text);
  }
  insert(this,idValue,text);
  return idValue;
}

Assistant:

uint64_t
IDManifest::ChannelGroupManifest::insert (const std::string& text)
{
    uint64_t hash;
    if (_hashScheme == MURMURHASH3_32) { hash = MurmurHash32 (text); }
    else if (_hashScheme == MURMURHASH3_64)
    {
        hash = MurmurHash64 (text);
    }
    else
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Cannot compute hash: unknown hashing scheme");
    }
    insert (hash, text);
    return hash;
}